

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SupportVectorClassifier::SupportVectorClassifier
          (SupportVectorClassifier *this,SupportVectorClassifier *from)

{
  void *pvVar1;
  Kernel *from_00;
  Kernel *this_00;
  SparseSupportVectors *this_01;
  SparseSupportVectors *from_01;
  DenseSupportVectors *this_02;
  DenseSupportVectors *from_02;
  StringVector *this_03;
  StringVector *from_03;
  Int64Vector *this_04;
  Int64Vector *from_04;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__SupportVectorClassifier_0034abd8
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<int>::RepeatedField
            (&this->numberofsupportvectorsperclass_,&from->numberofsupportvectorsperclass_);
  google::protobuf::RepeatedPtrField<CoreML::Specification::Coefficients>::RepeatedPtrField
            (&this->coefficients_,&from->coefficients_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->rho_,&from->rho_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->proba_,&from->proba_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->probb_,&from->probb_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->kernel_;
  if (from_00 == (Kernel *)0x0 ||
      from == (SupportVectorClassifier *)&_SupportVectorClassifier_default_instance_) {
    this_00 = (Kernel *)0x0;
  }
  else {
    this_00 = (Kernel *)operator_new(0x20);
    Kernel::Kernel(this_00,from_00);
  }
  this->kernel_ = this_00;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 4) {
    this_02 = mutable_densesupportvectors(this);
    from_02 = densesupportvectors(from);
    DenseSupportVectors::MergeFrom(this_02,from_02);
  }
  else if (from->_oneof_case_[0] == 3) {
    this_01 = mutable_sparsesupportvectors(this);
    from_01 = sparsesupportvectors(from);
    SparseSupportVectors::MergeFrom(this_01,from_01);
  }
  this->_oneof_case_[1] = 0;
  if (from->_oneof_case_[1] == 0x65) {
    this_04 = mutable_int64classlabels(this);
    from_04 = int64classlabels(from);
    Int64Vector::MergeFrom(this_04,from_04);
  }
  else if (from->_oneof_case_[1] == 100) {
    this_03 = mutable_stringclasslabels(this);
    from_03 = stringclasslabels(from);
    StringVector::MergeFrom(this_03,from_03);
  }
  return;
}

Assistant:

SupportVectorClassifier::SupportVectorClassifier(const SupportVectorClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      numberofsupportvectorsperclass_(from.numberofsupportvectorsperclass_),
      coefficients_(from.coefficients_),
      rho_(from.rho_),
      proba_(from.proba_),
      probb_(from.probb_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_kernel()) {
    kernel_ = new ::CoreML::Specification::Kernel(*from.kernel_);
  } else {
    kernel_ = NULL;
  }
  clear_has_supportVectors();
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.SupportVectorClassifier)
}